

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_session_copy(mbedtls_ssl_session *dst,mbedtls_ssl_session *src)

{
  bool bVar1;
  uchar uVar2;
  undefined2 uVar3;
  mbedtls_ssl_protocol_version mVar4;
  uint uVar5;
  mbedtls_x509_crt *crt;
  long lVar6;
  mbedtls_ssl_session *pmVar7;
  mbedtls_ssl_session *pmVar8;
  byte bVar9;
  
  bVar9 = 0;
  mbedtls_ssl_session_free(dst);
  pmVar7 = src;
  pmVar8 = dst;
  for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar2 = pmVar7->exported;
    uVar3 = *(undefined2 *)&pmVar7->field_0x2;
    mVar4 = pmVar7->tls_version;
    pmVar8->mfl_code = pmVar7->mfl_code;
    pmVar8->exported = uVar2;
    *(undefined2 *)&pmVar8->field_0x2 = uVar3;
    pmVar8->tls_version = mVar4;
    pmVar7 = (mbedtls_ssl_session *)((long)pmVar7 + (ulong)bVar9 * -0x10 + 8);
    pmVar8 = (mbedtls_ssl_session *)((long)pmVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  if (src->peer_cert == (mbedtls_x509_crt *)0x0) {
    return 0;
  }
  crt = (mbedtls_x509_crt *)calloc(1,0x2f0);
  dst->peer_cert = crt;
  if (crt == (mbedtls_x509_crt *)0x0) {
    src = (mbedtls_ssl_session *)0xffff8100;
  }
  else {
    mbedtls_x509_crt_init(crt);
    uVar5 = mbedtls_x509_crt_parse_der
                      (dst->peer_cert,(src->peer_cert->raw).p,(src->peer_cert->raw).len);
    if (uVar5 == 0) {
      bVar1 = true;
      goto LAB_001a581a;
    }
    src = (mbedtls_ssl_session *)(ulong)uVar5;
    free(dst->peer_cert);
    dst->peer_cert = (mbedtls_x509_crt *)0x0;
  }
  bVar1 = false;
LAB_001a581a:
  if (bVar1) {
    return 0;
  }
  return (int)src;
}

Assistant:

int mbedtls_ssl_session_copy(mbedtls_ssl_session *dst,
                             const mbedtls_ssl_session *src)
{
    mbedtls_ssl_session_free(dst);
    memcpy(dst, src, sizeof(mbedtls_ssl_session));
#if defined(MBEDTLS_SSL_SESSION_TICKETS) && defined(MBEDTLS_SSL_CLI_C)
    dst->ticket = NULL;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3) && \
    defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    dst->hostname = NULL;
#endif
#endif /* MBEDTLS_SSL_SESSION_TICKETS && MBEDTLS_SSL_CLI_C */

#if defined(MBEDTLS_X509_CRT_PARSE_C)

#if defined(MBEDTLS_SSL_KEEP_PEER_CERTIFICATE)
    if (src->peer_cert != NULL) {
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

        dst->peer_cert = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));
        if (dst->peer_cert == NULL) {
            return MBEDTLS_ERR_SSL_ALLOC_FAILED;
        }

        mbedtls_x509_crt_init(dst->peer_cert);

        if ((ret = mbedtls_x509_crt_parse_der(dst->peer_cert, src->peer_cert->raw.p,
                                              src->peer_cert->raw.len)) != 0) {
            mbedtls_free(dst->peer_cert);
            dst->peer_cert = NULL;
            return ret;
        }
    }
#else /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */
    if (src->peer_cert_digest != NULL) {
        dst->peer_cert_digest =
            mbedtls_calloc(1, src->peer_cert_digest_len);
        if (dst->peer_cert_digest == NULL) {
            return MBEDTLS_ERR_SSL_ALLOC_FAILED;
        }

        memcpy(dst->peer_cert_digest, src->peer_cert_digest,
               src->peer_cert_digest_len);
        dst->peer_cert_digest_type = src->peer_cert_digest_type;
        dst->peer_cert_digest_len = src->peer_cert_digest_len;
    }
#endif /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */

#endif /* MBEDTLS_X509_CRT_PARSE_C */

#if defined(MBEDTLS_SSL_SESSION_TICKETS) && defined(MBEDTLS_SSL_CLI_C)
    if (src->ticket != NULL) {
        dst->ticket = mbedtls_calloc(1, src->ticket_len);
        if (dst->ticket == NULL) {
            return MBEDTLS_ERR_SSL_ALLOC_FAILED;
        }

        memcpy(dst->ticket, src->ticket, src->ticket_len);
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_3) && \
    defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if (src->endpoint == MBEDTLS_SSL_IS_CLIENT) {
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        ret = mbedtls_ssl_session_set_hostname(dst, src->hostname);
        if (ret != 0) {
            return ret;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 &&
          MBEDTLS_SSL_SERVER_NAME_INDICATION */
#endif /* MBEDTLS_SSL_SESSION_TICKETS && MBEDTLS_SSL_CLI_C */

    return 0;
}